

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::
VarintErrorCasesWithSizes_ReadVarint64Error_LeavesValueInInitializedState_Test::TestBody
          (VarintErrorCasesWithSizes_ReadVarint64Error_LeavesValueInInitializedState_Test *this)

{
  int block_size;
  bool bVar1;
  ParamType *pPVar2;
  __tuple_element_t<0UL,_tuple<VarintErrorCase,_int>_> *p_Var3;
  __tuple_element_t<1UL,_tuple<VarintErrorCase,_int>_> *p_Var4;
  char *pcVar5;
  AssertHelper local_110;
  Message local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  Message local_e8;
  bool local_d9;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar;
  uint64_t value;
  undefined1 local_b0 [8];
  CodedInputStream coded_input;
  ArrayInputStream input;
  undefined8 uStack_38;
  int kBlockSizes_case;
  VarintErrorCase kVarintErrorCases_case;
  VarintErrorCasesWithSizes_ReadVarint64Error_LeavesValueInInitializedState_Test *this_local;
  
  kVarintErrorCases_case.name = (char *)this;
  pPVar2 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_int>_>
           ::GetParam();
  p_Var3 = std::get<0ul,google::protobuf::io::(anonymous_namespace)::VarintErrorCase,int>(pPVar2);
  kVarintErrorCases_case._24_8_ = p_Var3->name;
  uStack_38 = *(undefined8 *)p_Var3->bytes;
  kVarintErrorCases_case.bytes._0_8_ = *(undefined8 *)(p_Var3->bytes + 8);
  kVarintErrorCases_case._8_8_ = p_Var3->size;
  kVarintErrorCases_case.size = *(size_t *)&p_Var3->can_parse;
  pPVar2 = testing::
           WithParamInterface<std::tuple<google::protobuf::io::(anonymous_namespace)::VarintErrorCase,_int>_>
           ::GetParam();
  p_Var4 = std::get<1ul,google::protobuf::io::(anonymous_namespace)::VarintErrorCase,int>(pPVar2);
  block_size = *p_Var4;
  memcpy(&io::(anonymous_namespace)::CodedStreamTest::buffer_,&stack0xffffffffffffffc8,
         kVarintErrorCases_case._8_8_);
  ArrayInputStream::ArrayInputStream
            ((ArrayInputStream *)&coded_input.extension_factory_,
             &io::(anonymous_namespace)::CodedStreamTest::buffer_,kVarintErrorCases_case.bytes._8_4_
             ,block_size);
  CodedInputStream::CodedInputStream
            ((CodedInputStream *)local_b0,(ZeroCopyInputStream *)&coded_input.extension_factory_);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  local_d9 = CodedInputStream::ReadVarint64
                       ((CodedInputStream *)local_b0,(uint64_t *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_d8,"kVarintErrorCases_case.can_parse",
             "coded_input.ReadVarint64(&value)",(bool *)&kVarintErrorCases_case.size,&local_d9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x1ba,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_100,"value","value",(unsigned_long *)&gtest_ar.message_,
             (unsigned_long *)&gtest_ar.message_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream_unittest.cc"
               ,0x1be,pcVar5);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  CodedInputStream::~CodedInputStream((CodedInputStream *)local_b0);
  ArrayInputStream::~ArrayInputStream((ArrayInputStream *)&coded_input.extension_factory_);
  return;
}

Assistant:

TEST_P(VarintErrorCasesWithSizes,
       ReadVarint64Error_LeavesValueInInitializedState) {
  VarintErrorCase kVarintErrorCases_case = std::get<0>(GetParam());
  int kBlockSizes_case = std::get<1>(GetParam());
  memcpy(buffer_, kVarintErrorCases_case.bytes, kVarintErrorCases_case.size);
  ArrayInputStream input(buffer_, static_cast<int>(kVarintErrorCases_case.size),
                         kBlockSizes_case);
  CodedInputStream coded_input(&input);

  uint64_t value = 0;
  EXPECT_EQ(kVarintErrorCases_case.can_parse, coded_input.ReadVarint64(&value));
  // While the specific value following a failure is not critical, we do want to
  // ensure that it doesn't get set to an uninitialized value. (This check fails
  // in MSAN mode if value has been set to an uninitialized value.)
  EXPECT_EQ(value, value);
}